

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::VerifyAssignmentVisitor::check_var(Var *var)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  IRNodeKind IVar4;
  undefined4 extraout_var;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  undefined4 extraout_var_00;
  element_type *peVar5;
  undefined4 extraout_var_01;
  size_type __n;
  StmtException *this_01;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  char (*format_str) [57];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str_00;
  __normal_iterator<kratos::Stmt_**,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_198;
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
  local_190 [8];
  __normal_iterator<kratos::Stmt_**,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_188;
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
  local_180 [8];
  v7 local_178 [32];
  string local_158;
  element_type *local_138;
  __shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *local_130;
  value_type *stmt_2;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range3_1;
  undefined1 local_100 [8];
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmt_list;
  value_type *stmt_1;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range3;
  bool has_error;
  value_type *stmt;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sources;
  bool is_top_level;
  Var *var_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *this;
  
  bVar2 = false;
  iVar3 = (*(var->super_IRNode)._vptr_IRNode[0x10])();
  this = (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          *)CONCAT44(extraout_var,iVar3);
  __end2 = std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin(this);
  stmt = (value_type *)
         std::
         unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
         ::end(this);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>,
                            (_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)&stmt
                           ), bVar1) {
    this_00 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>
              ::operator*(&__end2);
    peVar5 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    iVar3 = (*(peVar5->super_Stmt).super_IRNode._vptr_IRNode[4])();
    IVar4 = IRNode::ir_node_kind((IRNode *)CONCAT44(extraout_var_00,iVar3));
    if (IVar4 == GeneratorKind) {
      bVar2 = true;
      break;
    }
    std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
    operator++(&__end2);
  }
  bVar1 = false;
  if (bVar2) {
    __end3 = std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin(this);
    stmt_1 = (value_type *)
             std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::end(this);
    while (bVar2 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                              ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)
                               &stmt_1), bVar2) {
      stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::__detail::
                    _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
                    operator*(&__end3);
      peVar5 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stmt_list.
                             super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar3 = (*(peVar5->super_Stmt).super_IRNode._vptr_IRNode[4])();
      IVar4 = IRNode::ir_node_kind((IRNode *)CONCAT44(extraout_var_01,iVar3));
      if (IVar4 != GeneratorKind) {
        bVar1 = true;
        break;
      }
      std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
      operator++(&__end3);
    }
  }
  if (!bVar1) {
    return;
  }
  std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::vector
            ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)local_100);
  __n = std::
        unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
        ::size(this);
  std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::reserve
            ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)local_100,__n);
  __end3_1 = std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin(this);
  stmt_2 = (value_type *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::end(this);
  while (bVar2 = std::__detail::operator!=
                           (&__end3_1.
                             super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>,
                            (_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)
                            &stmt_2), bVar2) {
    local_130 = &std::__detail::
                 _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                           (&__end3_1)->
                 super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
    local_138 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get(local_130);
    std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::AssignStmt*>
              ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)local_100,&local_138);
    std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
    operator++(&__end3_1);
  }
  this_01 = (StmtException *)__cxa_allocate_exception(0x10);
  (*(var->super_IRNode)._vptr_IRNode[0x1f])(local_178);
  local_38 = &local_158;
  local_40 = "{0} has wire assignment yet is also used in always block";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_178;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string,char[57],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"{0} has wire assignment yet is also used in always block",(v7 *)vargs,
                  format_str,in_RCX);
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&var_local;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  format_str_00.size_ = (size_t)var_local;
  format_str_00.data_ = (char *)local_78.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_158,(detail *)local_78.data_,format_str_00,args);
  local_188._M_current =
       (Stmt **)std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::begin
                          ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)local_100);
  __gnu_cxx::
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>::
  __normal_iterator<kratos::Stmt**>(local_180,&local_188);
  local_198._M_current =
       (Stmt **)std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::end
                          ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)local_100);
  __gnu_cxx::
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>::
  __normal_iterator<kratos::Stmt**>(local_190,&local_198);
  StmtException::StmtException
            (this_01,&local_158,(const_iterator *)local_180,(const_iterator *)local_190);
  __cxa_throw(this_01,&StmtException::typeinfo,StmtException::~StmtException);
}

Assistant:

void inline static check_var(Var* var) {
        bool is_top_level = false;
        auto const& sources = var->sources();
        for (auto const& stmt : sources) {
            if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind) {
                is_top_level = true;
                break;
            }
        }

        // second pass the check all the assignments
        bool has_error = false;
        if (is_top_level) {
            for (auto const& stmt : sources) {
                if (stmt->parent()->ir_node_kind() != IRNodeKind::GeneratorKind) {
                    has_error = true;
                    break;
                }
            }
        }

        if (has_error) {
            std::vector<Stmt*> stmt_list;
            stmt_list.reserve(sources.size());
            // prepare the error
            for (auto const& stmt : sources) {
                stmt_list.emplace_back(stmt.get());
            }
            throw StmtException(::format("{0} has wire assignment yet is also used in always block",
                                         var->to_string()),
                                stmt_list.begin(), stmt_list.end());
        }
    }